

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.hpp
# Opt level: O1

void __thiscall openjij::graph::Sparse<float>::Sparse(Sparse<float> *this,Sparse<float> *param_1)

{
  size_t sVar1;
  undefined4 uVar2;
  __alloc_node_gen_t __alloc_node_gen;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_float>,_true>_>_>
  local_20;
  
  (this->super_Graph)._num_spins = (param_1->super_Graph)._num_spins;
  local_20._M_h = (__hashtable_alloc *)&this->_J;
  (this->_J)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->_J)._M_h._M_bucket_count = (param_1->_J)._M_h._M_bucket_count;
  (this->_J)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_J)._M_h._M_element_count = (param_1->_J)._M_h._M_element_count;
  uVar2 = *(undefined4 *)&(param_1->_J)._M_h._M_rehash_policy.field_0x4;
  sVar1 = (param_1->_J)._M_h._M_rehash_policy._M_next_resize;
  (this->_J)._M_h._M_rehash_policy._M_max_load_factor =
       (param_1->_J)._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->_J)._M_h._M_rehash_policy.field_0x4 = uVar2;
  (this->_J)._M_h._M_rehash_policy._M_next_resize = sVar1;
  (this->_J)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<std::pair<unsigned_long,unsigned_long>,std::pair<std::pair<unsigned_long,unsigned_long>const,float>,std::allocator<std::pair<std::pair<unsigned_long,unsigned_long>const,float>>,std::__detail::_Select1st,std::equal_to<std::pair<unsigned_long,unsigned_long>>,openjij::utility::PairHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::pair<unsigned_long,unsigned_long>,std::pair<std::pair<unsigned_long,unsigned_long>const,float>,std::allocator<std::pair<std::pair<unsigned_long,unsigned_long>const,float>>,std::__detail::_Select1st,std::equal_to<std::pair<unsigned_long,unsigned_long>>,openjij::utility::PairHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::pair<unsigned_long,unsigned_long>const,float>,true>>>>
            ((_Hashtable<std::pair<unsigned_long,unsigned_long>,std::pair<std::pair<unsigned_long,unsigned_long>const,float>,std::allocator<std::pair<std::pair<unsigned_long,unsigned_long>const,float>>,std::__detail::_Select1st,std::equal_to<std::pair<unsigned_long,unsigned_long>>,openjij::utility::PairHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_20._M_h,&(param_1->_J)._M_h,&local_20);
  this->_num_edges = param_1->_num_edges;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(&this->_list_adj_nodes,&param_1->_list_adj_nodes);
  return;
}

Assistant:

Sparse(const Sparse<FloatType> &) = default;